

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iinq.c
# Opt level: O2

void iinq_test_create_query_select_all_from_where_single_dictionary(planck_unit_test_t *tc)

{
  ion_dictionary_handler_t *piVar1;
  _func_ion_err_t_ion_dictionary_id_t *p_Var2;
  code *pcVar3;
  undefined8 uVar4;
  ion_err_t iVar5;
  planck_unit_result_t pVar6;
  char cVar7;
  ion_status_t iVar8;
  ion_dictionary_handler_t **ppiVar9;
  ion_dictionary_handler_t *piVar10;
  ion_dictionary_handler_t **ppiVar11;
  _func_ion_err_t_ion_dictionary_id_t_ion_key_type_t_ion_key_size_t_ion_value_size_t_ion_dictionary_size_t_ion_dictionary_compare_t_ion_dictionary_handler_t_ptr_ion_dictionary_t_ptr
  **state;
  ion_dictionary_handler_t **ppiVar12;
  ion_dictionary_handler_t **ppiVar13;
  code *pcStack_110;
  ion_dictionary_handler_t local_108;
  ion_dictionary_t local_b8;
  ion_predicate_t local_a0;
  ion_dict_cursor_t *local_80 [2];
  int *local_70;
  undefined1 *local_68;
  int *local_60;
  undefined1 *local_58;
  ion_dictionary_handler_t *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  piVar10 = &local_108;
  pcStack_110 = (code *)0x1016b7;
  iVar5 = iinq_create_source("test.inq",key_type_numeric_signed,4,4);
  pcStack_110 = (code *)0x1016d0;
  pVar6 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar5,0xc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                    );
  if (pVar6 != '\0') {
    local_38 = 1;
    pcStack_110 = (code *)0x1016f3;
    local_34 = local_38;
    iVar8 = iinq_insert("test.inq",&local_38,&local_34);
    pcStack_110 = (code *)0x101710;
    pVar6 = planck_unit_assert_int_are_equal
                      (tc,0,(int)iVar8.error,0xc6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                      );
    if (pVar6 != '\0') {
      pcStack_110 = (code *)0x10173a;
      pVar6 = planck_unit_assert_int_are_equal
                        (tc,1,iVar8.count,199,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                        );
      if (pVar6 != '\0') {
        pcStack_110 = (code *)0x10175c;
        local_30 = 1;
        local_2c = 1;
        iVar8 = iinq_insert("test.inq",&local_30,&local_2c);
        pcStack_110 = (code *)0x101779;
        pVar6 = planck_unit_assert_int_are_equal
                          (tc,0,(int)iVar8.error,0xcd,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                          );
        if (pVar6 != '\0') {
          pcStack_110 = (code *)0x10179f;
          pVar6 = planck_unit_assert_int_are_equal
                            (tc,1,iVar8.count,0xce,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                            );
          if (pVar6 != '\0') {
            local_b8.handler = &local_108;
            local_48 = 0;
            uStack_40 = 0;
            pcStack_110 = (code *)0x1017d9;
            local_50 = local_b8.handler;
            iVar5 = iinq_open_source("test.inq",&local_b8,local_b8.handler);
            if (iVar5 == '\0') {
              local_70 = (int *)((long)&local_108 -
                                ((long)((local_b8.instance)->record).key_size + 0xfU &
                                0xfffffffffffffff0));
              piVar10 = (ion_dictionary_handler_t *)
                        ((long)local_70 -
                        ((long)((local_b8.instance)->record).value_size + 0xfU & 0xfffffffffffffff0)
                        );
              local_68 = (undefined1 *)piVar10;
              local_60 = local_70;
              local_58 = (undefined1 *)piVar10;
              *(undefined8 *)((long)piVar10 + -8) = 2;
              uVar4 = *(undefined8 *)((long)piVar10 + -8);
              *(undefined8 *)((long)piVar10 + -8) = 0x101833;
              iVar5 = dictionary_build_predicate(&local_a0,(ion_predicate_type_t)uVar4);
              if (iVar5 == '\0') {
                *(undefined8 *)((long)piVar10 + -8) = 0x10184e;
                dictionary_find(&local_b8,&local_a0,local_80);
                ppiVar13 = &local_50;
                for (ppiVar9 = ppiVar13;
                    (ppiVar11 = ppiVar13, ppiVar12 = ppiVar13, ppiVar9 != ppiVar13 &&
                    (ppiVar9 != (ion_dictionary_handler_t **)0x0));
                    ppiVar9 = (ion_dictionary_handler_t **)ppiVar9[1]) {
                  piVar1 = *ppiVar9;
                  p_Var2 = piVar1[1].destroy_dictionary;
                  pcVar3 = *(code **)(p_Var2 + 0x18);
                  *(undefined8 *)((long)piVar10 + -8) = 0x10186f;
                  cVar7 = (*pcVar3)(p_Var2,&piVar1[2].create_dictionary);
                  *(char *)&(*ppiVar9)[1].open_dictionary = cVar7;
                  if ((cVar7 != '\x04') && (cVar7 != '\x02')) break;
                }
LAB_00101890:
                if (ppiVar11 != (ion_dictionary_handler_t **)0x0) {
                  state = (_func_ion_err_t_ion_dictionary_id_t_ion_key_type_t_ion_key_size_t_ion_value_size_t_ion_dictionary_size_t_ion_dictionary_compare_t_ion_dictionary_handler_t_ptr_ion_dictionary_t_ptr
                           **)((long)(*ppiVar11 + 2) + 8);
                  pcVar3 = *(code **)(*(_func_ion_err_t_ion_dictionary_id_t **)
                                       ((long)(*ppiVar11 + 1) + 0x38) + 0x18);
                  *(undefined8 *)((long)piVar10 + -8) = 0x1018ad;
                  cVar7 = (*pcVar3)();
                  piVar1 = *ppiVar11;
                  *(char *)&((ion_iinq_result_t *)((long)(piVar1 + 1) + 0x40))->num_bytes = cVar7;
                  if ((cVar7 == '\x02') || (cVar7 == '\x04')) {
                    if (ppiVar12 != ppiVar11) {
                      ppiVar11 = ppiVar13;
                    }
                    ppiVar9 = ppiVar13;
                    ppiVar12 = ppiVar11;
                    if (*local_70 == 1) {
                      for (; ppiVar9 != (ion_dictionary_handler_t **)0x0;
                          ppiVar9 = (ion_dictionary_handler_t **)ppiVar9[1]) {
                      }
                      *(undefined8 *)((long)piVar10 + -8) = 0x101944;
                      print_hello((ion_iinq_result_t *)piVar1,state);
                    }
                  }
                  else {
                    pcVar3 = *(code **)(*(uchar **)((long)(piVar1 + 1) + 0x38) + 0x20);
                    *(undefined8 *)((long)piVar10 + -8) = 0x1018d5;
                    (*pcVar3)((ion_iinq_result_t *)((long)(piVar1 + 1) + 0x38));
                    piVar1 = *ppiVar11;
                    *(undefined8 *)((long)piVar10 + -8) = 0x1018e8;
                    dictionary_find((ion_dictionary_t *)(piVar1 + 1),
                                    (ion_predicate_t *)((long)(piVar1 + 1) + 0x18),
                                    (ion_dict_cursor_t **)((long)(piVar1 + 1) + 0x38));
                    piVar1 = *ppiVar11;
                    p_Var2 = *(_func_ion_err_t_ion_dictionary_id_t **)((long)(piVar1 + 1) + 0x38);
                    pcVar3 = *(code **)(p_Var2 + 0x18);
                    *(undefined8 *)((long)piVar10 + -8) = 0x1018fc;
                    cVar7 = (*pcVar3)(p_Var2,(_func_ion_err_t_ion_dictionary_id_t_ion_key_type_t_ion_key_size_t_ion_value_size_t_ion_dictionary_size_t_ion_dictionary_compare_t_ion_dictionary_handler_t_ptr_ion_dictionary_t_ptr
                                              **)((long)(piVar1 + 2) + 8));
                    *(char *)((long)(*ppiVar11 + 1) + 0x40) = cVar7;
                    if ((cVar7 != '\x04') && (cVar7 != '\x02')) goto LAB_00101970;
                    ppiVar11 = (ion_dictionary_handler_t **)ppiVar11[2];
                  }
                  goto LAB_00101890;
                }
LAB_00101970:
                for (; ppiVar13 != (ion_dictionary_handler_t **)0x0;
                    ppiVar13 = (ion_dictionary_handler_t **)ppiVar13[1]) {
                  piVar1 = *ppiVar13;
                  pcVar3 = *(code **)(*(_func_ion_err_t_ion_dictionary_id_t **)
                                       ((long)(piVar1 + 1) + 0x38) + 0x20);
                  *(undefined8 *)((long)piVar10 + -8) = 0x101960;
                  (*pcVar3)((_func_ion_err_t_ion_dictionary_id_t **)((long)(piVar1 + 1) + 0x38));
                  piVar1 = *ppiVar13;
                  *(undefined8 *)((long)piVar10 + -8) = 0x10196c;
                  ion_close_dictionary((ion_dictionary_t *)(piVar1 + 1));
                }
              }
            }
            *(undefined8 *)((long)piVar10 + -8) = 0x101981;
            iinq_drop("test.inq");
            return;
          }
        }
      }
    }
  }
  pcStack_110 = iinq_test_create_query_select_all_from_where_two_dictionaries;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
iinq_test_create_query_select_all_from_where_single_dictionary(
	planck_unit_test_t *tc
) {
	ion_err_t					error;
	ion_status_t				status;
	ion_iinq_query_processor_t	processor;

	ion_key_type_t		key_type;
	ion_key_size_t		key_size;
	ion_value_size_t	value_size;
	ion_key_t			key;
	ion_value_t			value;

	processor	= IINQ_QUERY_PROCESSOR(print_hello, NULL);

	key_type	= key_type_numeric_signed;
	key_size	= sizeof(int);
	value_size	= sizeof(int);

	error		= CREATE_DICTIONARY(test, key_type, key_size, value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	key			= IONIZE(1, int);
	value		= IONIZE(1, int);

	status		= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	key		= IONIZE(1, int);
	value	= IONIZE(1, int);

	status	= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	QUERY(SELECT_ALL, FROM(test), WHERE(NEUTRALIZE(test.key, int) == 1), , , , , , &processor);

	DROP(test);
}